

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O3

json_string *
JSONWorker::FixString(json_string *__return_storage_ptr__,json_string *value_t,bool *flag)

{
  char *pcVar1;
  char *end;
  char *local_30;
  
  *flag = false;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar1 = (value_t->_M_dataplus)._M_p;
  if (value_t->_M_string_length != 0) {
    end = pcVar1 + value_t->_M_string_length;
    do {
      if (*pcVar1 == '\\') {
        *flag = true;
        local_30 = pcVar1 + 1;
        SpecialChar(&local_30,end,__return_storage_ptr__);
        pcVar1 = local_30;
      }
      else {
        local_30 = pcVar1;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pcVar1 = pcVar1 + 1;
    } while (pcVar1 != end);
  }
  return __return_storage_ptr__;
}

Assistant:

json_string JSONWorker::FixString(const json_string & value_t, bool & flag) json_nothrow {
    #define setflag(x) flag = x
#endif

    //Do things like unescaping
    setflag(false);
    json_string res;
    res.reserve(value_t.length());	 //since it goes one character at a time, want to reserve it first so that it doens't have to reallocating
	const json_char * const end = value_t.data() + value_t.length();
    for(const json_char * p = value_t.data(); p != end; ++p){
	   switch (*p){
		  case JSON_TEXT('\\'):
			 setflag(true);
			 SpecialChar(++p, end, res);
			 break;
		  default:
			 res += *p;
			 break;
	   }
    }
	shrinkString(res);  //because this is actually setting something to be stored, shrink it it need be
	return res;
}